

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_sorted_merge(lyxp_set *trg,lyxp_set *src,lyd_node *cur_node,int options)

{
  int iVar1;
  lyxp_set_nodes *plVar2;
  LY_ERR *pLVar3;
  bool bVar4;
  lyxp_node_type local_4c;
  lyd_node *plStack_48;
  lyxp_node_type root_type;
  lyd_node *root;
  int cmp;
  uint32_t dup_count;
  uint32_t count;
  uint32_t j;
  uint32_t i;
  int options_local;
  lyd_node *cur_node_local;
  lyxp_set *src_local;
  lyxp_set *trg_local;
  
  if (((trg->type == LYXP_SET_NODE_SET) || (trg->type == LYXP_SET_EMPTY)) &&
     ((src->type == LYXP_SET_NODE_SET || (src->type == LYXP_SET_EMPTY)))) {
    if (src->type == LYXP_SET_EMPTY) {
      trg_local._4_4_ = 0;
    }
    else {
      j = options;
      _i = cur_node;
      cur_node_local = (lyd_node *)src;
      src_local = trg;
      if (trg->type == LYXP_SET_EMPTY) {
        set_fill_set(trg,src);
        lyxp_set_cast((lyxp_set *)cur_node_local,LYXP_SET_EMPTY,_i,(lys_module *)0x0,j);
        trg_local._4_4_ = 0;
      }
      else {
        plStack_48 = moveto_get_root(cur_node,options,&local_4c);
        iVar1 = set_assign_pos(src_local,plStack_48,local_4c);
        if ((iVar1 == 0) &&
           (iVar1 = set_assign_pos((lyxp_set *)cur_node_local,plStack_48,local_4c), iVar1 == 0)) {
          if ('\x02' < ly_log_level) {
            ly_log_dbg(LY_LDGXPATH,"MERGE target");
          }
          print_set_debug(src_local);
          if ('\x02' < ly_log_level) {
            ly_log_dbg(LY_LDGXPATH,"MERGE source");
          }
          print_set_debug((lyxp_set *)cur_node_local);
          if (src_local->size - src_local->used < *(uint *)&cur_node_local->prev) {
            src_local->size = src_local->used + *(int *)&cur_node_local->prev;
            plVar2 = (lyxp_set_nodes *)
                     ly_realloc((src_local->val).nodes,(ulong)src_local->size << 4);
            (src_local->val).nodes = plVar2;
            if ((src_local->val).nodes == (lyxp_set_nodes *)0x0) {
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_sorted_merge");
              return -1;
            }
          }
          count = 0;
          dup_count = 0;
          cmp = 0;
          root._4_4_ = 0;
          do {
            root._0_4_ = set_sort_compare((lyxp_set_nodes *)
                                          (&cur_node_local->attr->parent + (ulong)count * 2),
                                          (src_local->val).nodes + dup_count,plStack_48);
            if ((int)root == 0) {
              if (cmp != 0) {
                cmp = cmp + 1;
                root._4_4_ = root._4_4_ + 1;
              }
              count = count + 1;
              dup_count = dup_count + 1;
            }
            else if ((int)root < 0) {
              cmp = cmp + 1;
              count = count + 1;
            }
            else {
              if (cmp != 0) goto LAB_001a6925;
              dup_count = dup_count + 1;
            }
            while( true ) {
              bVar4 = false;
              if (count < *(uint *)&cur_node_local->prev) {
                bVar4 = dup_count < src_local->used;
              }
              if (bVar4) break;
              if ((*(uint *)&cur_node_local->prev <= count) && (cmp == 0)) {
                if ('\x02' < ly_log_level) {
                  ly_log_dbg(LY_LDGXPATH,"MERGE result");
                }
                print_set_debug(src_local);
                lyxp_set_cast((lyxp_set *)cur_node_local,LYXP_SET_EMPTY,_i,(lys_module *)0x0,j);
                return 0;
              }
              cmp = (*(int *)&cur_node_local->prev - count) + cmp;
              count = *(uint32_t *)&cur_node_local->prev;
LAB_001a6925:
              memmove((src_local->val).nodes + (dup_count + (cmp - root._4_4_)),
                      (src_local->val).nodes + dup_count,(ulong)(src_local->used - dup_count) << 4);
              memcpy((src_local->val).nodes + (dup_count - root._4_4_),
                     &cur_node_local->attr->parent + (ulong)(count - cmp) * 2,(ulong)(uint)cmp << 4)
              ;
              src_local->used = (cmp - root._4_4_) + src_local->used;
              dup_count = (cmp - root._4_4_) + dup_count;
              cmp = 0;
              root._4_4_ = 0;
            }
          } while( true );
        }
        trg_local._4_4_ = -1;
      }
    }
  }
  else {
    trg_local._4_4_ = -1;
  }
  return trg_local._4_4_;
}

Assistant:

static int
set_sorted_merge(struct lyxp_set *trg, struct lyxp_set *src, struct lyd_node *cur_node, int options)
{
    uint32_t i, j, count, dup_count;
    int cmp;
    const struct lyd_node *root;
    enum lyxp_node_type root_type;

    if (((trg->type != LYXP_SET_NODE_SET) && (trg->type != LYXP_SET_EMPTY))
            || ((src->type != LYXP_SET_NODE_SET) && (src->type != LYXP_SET_EMPTY))) {
        return -1;
    }

    if (src->type == LYXP_SET_EMPTY) {
        return 0;
    } else if (trg->type == LYXP_SET_EMPTY) {
        set_fill_set(trg, src);
        lyxp_set_cast(src, LYXP_SET_EMPTY, cur_node, NULL, options);
        return 0;
    }

    /* get root */
    root = moveto_get_root(cur_node, options, &root_type);

    /* fill positions */
    if (set_assign_pos(trg, root, root_type) || set_assign_pos(src, root, root_type)) {
        return -1;
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "MERGE target");
    print_set_debug(trg);
    LOGDBG(LY_LDGXPATH, "MERGE source");
    print_set_debug(src);
#endif

    /* make memory for the merge (duplicates are not detected yet, so space
     * will likely be wasted on them, too bad) */
    if (trg->size - trg->used < src->used) {
        trg->size = trg->used + src->used;

        trg->val.nodes = ly_realloc(trg->val.nodes, trg->size * sizeof *trg->val.nodes);
        if (!trg->val.nodes) {
            LOGMEM;
            return -1;
        }
    }

    i = 0;
    j = 0;
    count = 0;
    dup_count = 0;
    do {
        cmp = set_sort_compare(&src->val.nodes[i], &trg->val.nodes[j], root);
        if (!cmp) {
            if (!count) {
                /* duplicate, just skip it */
                ++i;
                ++j;
            } else {
                /* we are copying something already, so let's copy the duplicate too,
                 * we are hoping that afterwards there are some more nodes to
                 * copy and this way we can copy them all together */
                ++count;
                ++dup_count;
                ++i;
                ++j;
            }
        } else if (cmp < 0) {
            /* inserting src node into trg, just remember it for now */
            ++count;
            ++i;
        } else if (count) {
copy_nodes:
            /* time to actually copy the nodes, we have found the largest block of nodes */
            memmove(&trg->val.nodes[j + (count - dup_count)],
                    &trg->val.nodes[j],
                    (trg->used - j) * sizeof *trg->val.nodes);
            memcpy(&trg->val.nodes[j - dup_count], &src->val.nodes[i - count], count * sizeof *src->val.nodes);

            trg->used += count - dup_count;
            /* do not change i, except the copying above, we are basically doing exactly what is in the else branch below */
            j += count - dup_count;

            count = 0;
            dup_count = 0;
        } else {
            ++j;
        }
    } while ((i < src->used) && (j < trg->used));

    if ((i < src->used) || count) {
        /* loop ended, but we need to copy something at trg end */
        count += src->used - i;
        i = src->used;
        goto copy_nodes;
    }

#ifndef NDEBUG
    LOGDBG(LY_LDGXPATH, "MERGE result");
    print_set_debug(trg);
#endif

    lyxp_set_cast(src, LYXP_SET_EMPTY, cur_node, NULL, options);
    return 0;
}